

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::SetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  ThreadSafeArena *this_00;
  Extension *pEVar1;
  anon_union_8_9_fdc4a54a_for_Extension_0 this_01;
  ThreadSafeArena *pTVar2;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  
  if (message == (MessageLite *)0x0) {
    pEVar1 = FindOrNull(this,number);
    if (pEVar1 == (Extension *)0x0) {
      return;
    }
    Extension::Clear(pEVar1);
    return;
  }
  this_00 = &this->arena_->impl_;
  pTVar2 = (ThreadSafeArena *)(message->_internal_metadata_).ptr_;
  if (((ulong)pTVar2 & 1) != 0) {
    pTVar2 = *(ThreadSafeArena **)((ulong)pTVar2 & 0xfffffffffffffffe);
  }
  if (pTVar2 == this_00 || pTVar2 == (ThreadSafeArena *)0x0) {
    pVar3 = Insert(this,number);
    pEVar1 = pVar3.first;
    pEVar1->descriptor = descriptor;
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pEVar1->type = type;
      if ((byte)(type - 0x13) < 0xee) goto LAB_00282f3e;
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) == 10) {
        pEVar1->is_repeated = false;
        pEVar1->field_0xa = (pEVar1->field_0xa & 0xfa) + 1;
        goto LAB_00282ec3;
      }
      goto LAB_00282f52;
    }
    if (pEVar1->is_repeated != false) goto LAB_00282f48;
    if (0xed < (byte)(pEVar1->type - 0x13)) {
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) != 10)
      goto LAB_00282f66;
      if ((pEVar1->field_0xa & 4) != 0) {
        (**(code **)(**(long **)&(pEVar1->field_0).int32_t_value + 0x30))
                  (*(long **)&(pEVar1->field_0).int32_t_value,message,this_00);
        goto LAB_00282f13;
      }
      if ((this_00 == (ThreadSafeArena *)0x0) &&
         ((long *)(pEVar1->field_0).int64_t_value != (long *)0x0)) {
        (**(code **)(*(long *)(pEVar1->field_0).int64_t_value + 8))();
      }
LAB_00282ec3:
      if (pTVar2 == this_00) {
        pEVar1->field_0 = (anon_union_8_9_fdc4a54a_for_Extension_0)message;
      }
      else if (pTVar2 == (ThreadSafeArena *)0x0) {
        pEVar1->field_0 = (anon_union_8_9_fdc4a54a_for_Extension_0)message;
        ThreadSafeArena::AddCleanup
                  (this_00,message,arena_delete_object<google::protobuf::MessageLite>);
      }
      else {
        this_01 = (anon_union_8_9_fdc4a54a_for_Extension_0)
                  MessageLite::New(message,(Arena *)this_00);
        pEVar1->field_0 = this_01;
        MessageLite::CheckTypeAndMergeFrom((MessageLite *)this_01,message);
      }
LAB_00282f13:
      pEVar1->field_0xa = pEVar1->field_0xa & 0xfd;
      return;
    }
  }
  else {
    SetAllocatedMessage((ExtensionSet *)&stack0xffffffffffffffc0);
LAB_00282f3e:
    SetAllocatedMessage((ExtensionSet *)&stack0xffffffffffffffc0);
LAB_00282f48:
    SetAllocatedMessage((ExtensionSet *)&stack0xffffffffffffffc0);
LAB_00282f52:
    SetAllocatedMessage();
  }
  SetAllocatedMessage((ExtensionSet *)&stack0xffffffffffffffc0);
LAB_00282f66:
  SetAllocatedMessage();
}

Assistant:

void ExtensionSet::SetAllocatedMessage(int number, FieldType type,
                                       const FieldDescriptor* descriptor,
                                       MessageLite* message) {
  if (message == nullptr) {
    ClearExtension(number);
    return;
  }
  Arena* const arena = arena_;
  Arena* const message_arena = message->GetArena();
  ABSL_DCHECK(message_arena == nullptr || message_arena == arena);

  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->is_lazy = false;
    if (message_arena == arena) {
      extension->ptr.message_value = message;
    } else if (message_arena == nullptr) {
      extension->ptr.message_value = message;
      arena->Own(message);  // not nullptr because not equal to message_arena
    } else {
      extension->ptr.message_value = message->New(arena);
      extension->ptr.message_value->CheckTypeAndMergeFrom(*message);
    }
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->ptr.lazymessage_value->SetAllocatedMessage(message, arena);
    } else {
      if (arena == nullptr) {
        delete extension->ptr.message_value;
      }
      if (message_arena == arena) {
        extension->ptr.message_value = message;
      } else if (message_arena == nullptr) {
        extension->ptr.message_value = message;
        arena->Own(message);  // not nullptr because not equal to message_arena
      } else {
        extension->ptr.message_value = message->New(arena);
        extension->ptr.message_value->CheckTypeAndMergeFrom(*message);
      }
    }
  }
  extension->is_cleared = false;
}